

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

ssize_t __thiscall
gnuplotio::Gnuplot::send(Gnuplot *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  void *__buf_00;
  undefined4 in_register_00000034;
  long *plVar2;
  long *local_78 [2];
  long local_68 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<gnuplotio::PlotData,_std::allocator<gnuplotio::PlotData>_> local_40;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,__fd);
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)local_78,*plVar2,plVar2[1] + *plVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(plVar2 + 4));
  std::vector<gnuplotio::PlotData,_std::allocator<gnuplotio::PlotData>_>::vector
            (&local_40,
             (vector<gnuplotio::PlotData,_std::allocator<gnuplotio::PlotData>_> *)(plVar2 + 7));
  sVar1 = send(this,(int)local_78,__buf_00,__n,__flags);
  std::vector<gnuplotio::PlotData,_std::allocator<gnuplotio::PlotData>_>::~vector(&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return sVar1;
}

Assistant:

Gnuplot &send(const PlotGroup &plot_group) {
        return send(PlotGroup(plot_group));
    }